

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_PLTE(ucvector *out,LodePNGColorMode *info)

{
  long lVar1;
  long lStack_38;
  uint error;
  size_t j;
  size_t i;
  uchar *chunk;
  LodePNGColorMode *info_local;
  ucvector *out_local;
  
  lStack_38 = 8;
  chunk = (uchar *)info;
  info_local = (LodePNGColorMode *)out;
  out_local._4_4_ = lodepng_chunk_init((uchar **)&i,out,(int)info->palettesize * 3,"PLTE");
  if (out_local._4_4_ == 0) {
    for (j = 0; j != *(size_t *)(chunk + 0x10); j = j + 1) {
      *(undefined1 *)(i + lStack_38) = *(undefined1 *)(*(long *)(chunk + 8) + j * 4);
      lVar1 = lStack_38 + 2;
      *(undefined1 *)(i + lStack_38 + 1) = *(undefined1 *)(*(long *)(chunk + 8) + 1 + j * 4);
      lStack_38 = lStack_38 + 3;
      *(undefined1 *)(i + lVar1) = *(undefined1 *)(*(long *)(chunk + 8) + 2 + j * 4);
    }
    lodepng_chunk_generate_crc((uchar *)i);
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned addChunk_PLTE(ucvector* out, const LodePNGColorMode* info) {
  unsigned char* chunk;
  size_t i, j = 8;

  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, info->palettesize * 3, "PLTE"));

  for(i = 0; i != info->palettesize; ++i) {
    /*add all channels except alpha channel*/
    chunk[j++] = info->palette[i * 4 + 0];
    chunk[j++] = info->palette[i * 4 + 1];
    chunk[j++] = info->palette[i * 4 + 2];
  }

  lodepng_chunk_generate_crc(chunk);
  return 0;
}